

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relay.cpp
# Opt level: O2

void __thiscall TCPRelayHandler::HandleEvent(TCPRelayHandler *this,SOCKET s,int event)

{
  int iVar1;
  string asStack_38 [32];
  
  if (this->remote_socket_ == s) {
    if ((event & 8U) != 0) {
      OnRemoteError(this);
    }
    iVar1 = this->stage_;
    if ((event & 0x11U) != 0 && iVar1 != -1) {
      OnRemoteRead(this);
      iVar1 = this->stage_;
    }
    if (((event & 4U) != 0) && (iVar1 != -1)) {
      OnRemoteWrite(this);
    }
  }
  else if (this->local_socket_ == s) {
    if ((event & 8U) != 0) {
      OnLocalError(this);
    }
    iVar1 = this->stage_;
    if ((event & 0x11U) != 0 && iVar1 != -1) {
      OnLocalRead(this);
      iVar1 = this->stage_;
    }
    if (((event & 4U) != 0) && (iVar1 != -1)) {
      OnLocalWrite(this);
    }
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,asStack_38);
    std::operator<<((ostream *)&std::cout," [warning] ");
    std::operator<<((ostream *)&std::cout,"unknown socket\n");
    std::__cxx11::string::~string(asStack_38);
  }
  if (this->stage_ == -1) {
    (*(this->super_IDNSNotify)._vptr_IDNSNotify[1])(this);
  }
  return;
}

Assistant:

void TCPRelayHandler::HandleEvent(SOCKET s, int event)
{
    // order is important
    if (s == remote_socket_)
    {
        if (event & kPollErr)
        {
            OnRemoteError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnRemoteRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnRemoteWrite();
        }
    }
    else if (s == local_socket_)
    {
        if (event & kPollErr)
        {
            OnLocalError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnLocalRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnLocalWrite();
        }
    }
    else
        LOGW << "unknown socket\n";
    if (IsDestroyed())
    {
        //free memory when it mark destroyed
        delete this;
    }
}